

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O2

error_code __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::init_asio
          (connection<websocketpp::config::asio::transport_config> *this,io_service_ptr io_service)

{
  error_code eVar1;
  __shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  io_service_ptr local_38;
  __shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this->m_io_service = io_service;
  local_38 = io_service;
  std::make_shared<asio::io_context::strand,std::reference_wrapper<asio::io_context>>
            ((reference_wrapper<asio::io_context> *)&local_30);
  std::__shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_strand).
              super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  std::__shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,
             &(this->m_strand).
              super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>);
  eVar1 = basic_socket::connection::init_asio
                    (&this->super_socket_con_type,io_service,(strand_ptr *)&_Stack_48,
                     this->m_is_server);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  eVar1._4_4_ = 0;
  return eVar1;
}

Assistant:

lib::error_code init_asio (io_service_ptr io_service) {
        m_io_service = io_service;

        if (config::enable_multithreading) {
            m_strand = lib::make_shared<lib::asio::io_service::strand>(
                lib::ref(*io_service));
        }

        lib::error_code ec = socket_con_type::init_asio(io_service, m_strand,
            m_is_server);

        return ec;
    }